

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O1

int __thiscall ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob)

{
  uint uVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  Layer *pLVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  void *pvVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  bool bVar23;
  float fVar24;
  undefined1 auVar25 [16];
  vector<int,_std::allocator<int>_> _space_ofs;
  ParamDict pd;
  long local_578;
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  long local_4e8;
  void *local_4e0;
  long local_4d8;
  long local_4d0;
  ulong local_4c8;
  void *local_4c0;
  long local_4b8;
  void *local_4b0;
  ModelBinFromMatArray local_4a8;
  ParamDict local_498;
  
  if (((bottom_blob->dims == 1) && (this->kernel_w == 1)) && (this->kernel_h == 1)) {
    iVar4 = this->weight_data_size / this->num_output;
    iVar9 = bottom_blob->w;
    if (iVar9 == iVar4) {
      pLVar6 = create_layer(0xf);
      ParamDict::ParamDict(&local_498);
      ParamDict::set(&local_498,0,this->num_output);
      ParamDict::set(&local_498,1,this->bias_term);
      ParamDict::set(&local_498,2,this->weight_data_size);
      (*pLVar6->_vptr_Layer[2])(pLVar6,&local_498);
      local_528 = (undefined1  [16])0x0;
      local_538 = (undefined1  [16])0x0;
      local_548 = (undefined1  [16])0x0;
      if ((Mat *)local_548 != &this->weight_data) {
        piVar2 = (this->weight_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_548._0_8_ = (this->weight_data).data;
        local_548._8_8_ = (this->weight_data).refcount;
        local_538._0_8_ = (this->weight_data).elemsize;
        local_538._8_4_ = (this->weight_data).dims;
        local_538._12_4_ = (this->weight_data).w;
        local_528._0_4_ = (this->weight_data).h;
        local_528._4_4_ = (this->weight_data).c;
        local_528._8_8_ = (this->weight_data).cstep;
      }
      local_4f8 = (undefined1  [16])0x0;
      local_508 = (undefined1  [16])0x0;
      local_518 = (undefined1  [16])0x0;
      if ((Mat *)local_518 != &this->bias_data) {
        piVar2 = (this->bias_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_518._0_8_ = (this->bias_data).data;
        local_518._8_8_ = (this->bias_data).refcount;
        local_508._0_8_ = (this->bias_data).elemsize;
        local_508._8_4_ = (this->bias_data).dims;
        local_508._12_4_ = (this->bias_data).w;
        local_4f8._0_4_ = (this->bias_data).h;
        local_4f8._4_4_ = (this->bias_data).c;
        local_4f8._8_8_ = (this->bias_data).cstep;
      }
      ModelBinFromMatArray::ModelBinFromMatArray(&local_4a8,(Mat *)local_548);
      (*pLVar6->_vptr_Layer[3])(pLVar6,&local_4a8);
      (*pLVar6->_vptr_Layer[5])(pLVar6,bottom_blob,top_blob);
      (*pLVar6->_vptr_Layer[1])(pLVar6);
      lVar13 = 0x30;
      do {
        piVar2 = *(int **)(local_548 + lVar13 + 8);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) &&
             (lVar3 = *(long *)*(undefined1 (*) [16])(local_548 + lVar13), lVar3 != 0)) {
            free(*(void **)(lVar3 + -8));
          }
        }
        *(undefined1 (*) [16])(local_528 + lVar13) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(local_538 + lVar13) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(local_548 + lVar13) = (undefined1  [16])0x0;
        lVar13 = lVar13 + -0x30;
      } while (lVar13 != -0x30);
      lVar13 = 0x430;
      do {
        pauVar21 = (undefined1 (*) [16])((long)&local_498.params[0].loaded + lVar13);
        piVar2 = *(int **)((long)&local_498.params[0].v.data + lVar13);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (lVar3 = *(long *)*pauVar21, lVar3 != 0)) {
            free(*(void **)(lVar3 + -8));
          }
        }
        *(undefined1 (*) [16])((long)&local_498.params[0].v.dims + lVar13) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)&local_498.params[0].v.refcount + lVar13) =
             (undefined1  [16])0x0;
        *pauVar21 = (undefined1  [16])0x0;
        lVar13 = lVar13 + -0x38;
      } while (lVar13 != -0x30);
      if (iVar9 == iVar4) {
        return 0;
      }
    }
  }
  iVar9 = bottom_blob->w;
  iVar4 = bottom_blob->h;
  uVar1 = bottom_blob->c;
  uVar20 = (this->kernel_w + -1) * this->dilation_w;
  uVar15 = (this->kernel_h + -1) * this->dilation_h;
  local_498.params[0]._0_8_ = bottom_blob->data;
  local_498.params[0].v.data = bottom_blob->refcount;
  local_498.params[0].v.refcount = (int *)bottom_blob->elemsize;
  local_498.params[0].v.elemsize._0_4_ = bottom_blob->dims;
  if ((int *)local_498.params[0].v.data != (int *)0x0) {
    LOCK();
    *(int *)local_498.params[0].v.data = *local_498.params[0].v.data + 1;
    UNLOCK();
  }
  local_498.params[0].v._20_8_ = *(undefined8 *)&bottom_blob->w;
  local_498.params[0].v.w = bottom_blob->c;
  local_498.params[0].v._32_8_ = bottom_blob->cstep;
  iVar5 = this->pad_w;
  if ((iVar5 < 1) && (this->pad_h < 1)) {
    if (this->pad_h == -0xe9 && iVar5 == -0xe9) {
      iVar19 = uVar20 - (iVar9 + -1) % this->stride_w;
      iVar5 = uVar15 - (iVar4 + -1) % this->stride_h;
      if ((iVar19 < 1) && (iVar5 < 1)) {
LAB_00131309:
        iVar5 = 0;
        bVar23 = true;
        iVar9 = local_498.params[0].v.elemsize._4_4_;
        iVar4 = local_498.params[0].v.dims;
      }
      else {
        copy_make_border(bottom_blob,(Mat *)&local_498,iVar5 / 2,iVar5 - iVar5 / 2,iVar19 / 2,
                         iVar19 - iVar19 / 2,0,0.0);
        iVar5 = -100;
        if ((void *)local_498.params[0]._0_8_ == (void *)0x0) {
          bVar23 = false;
        }
        else {
          if ((long)local_498.params[0].v.w * local_498.params[0].v._32_8_ != 0) goto LAB_00131309;
          bVar23 = false;
        }
      }
      if (!bVar23) goto LAB_0013121a;
    }
  }
  else {
    copy_make_border(bottom_blob,(Mat *)&local_498,this->pad_h,this->pad_h,iVar5,iVar5,0,0.0);
    iVar5 = -100;
    if (((void *)local_498.params[0]._0_8_ == (void *)0x0) ||
       ((long)local_498.params[0].v.w * local_498.params[0].v._32_8_ == 0)) goto LAB_0013121a;
    iVar9 = local_498.params[0].v.elemsize._4_4_;
    iVar4 = local_498.params[0].v.dims;
  }
  uVar14 = (long)(int)(~uVar20 + iVar9) / (long)this->stride_w;
  local_4c8 = uVar14 & 0xffffffff;
  iVar19 = (int)(~uVar15 + iVar4) / this->stride_h;
  uVar15 = (int)uVar14 + 1;
  iVar12 = iVar19 + 1;
  iVar4 = this->num_output;
  auVar25._0_4_ = -(uint)(top_blob->dims == 3);
  auVar25._4_4_ = -(uint)(uVar15 == top_blob->w);
  auVar25._8_4_ = -(uint)(iVar12 == top_blob->h);
  auVar25._12_4_ = -(uint)(iVar4 == top_blob->c);
  iVar5 = movmskps(3,auVar25);
  if ((iVar5 != 0xf) || (top_blob->elemsize != 4)) {
    piVar2 = top_blob->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (top_blob->data != (void *)0x0)) {
        free(*(void **)((long)top_blob->data + -8));
      }
    }
    top_blob->elemsize = 0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->elemsize = 4;
    top_blob->dims = 3;
    top_blob->w = uVar15;
    top_blob->h = iVar12;
    top_blob->c = iVar4;
    uVar14 = (long)(int)(iVar12 * uVar15) + 3U & 0x3ffffffffffffffc;
    top_blob->cstep = uVar14;
    lVar13 = uVar14 * (long)iVar4;
    if (lVar13 != 0) {
      pvVar7 = malloc(lVar13 * 4 + 0x1c);
      pvVar10 = (void *)((long)pvVar7 + 0x17U & 0xfffffffffffffff0);
      *(void **)((long)pvVar10 - 8) = pvVar7;
      top_blob->data = pvVar10;
      piVar2 = (int *)((long)pvVar10 + lVar13 * 4);
      top_blob->refcount = piVar2;
      *piVar2 = 1;
    }
  }
  iVar5 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    uVar20 = this->kernel_w * this->kernel_h;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_548,(long)(int)uVar20,
               (allocator_type *)&local_4a8);
    if (0 < this->kernel_h) {
      iVar4 = this->dilation_h;
      iVar5 = this->dilation_w;
      iVar12 = this->kernel_w;
      iVar8 = 0;
      iVar11 = 0;
      iVar16 = 0;
      do {
        if (0 < this->kernel_w) {
          lVar13 = 0;
          do {
            *(int *)(local_548._0_8_ + (iVar16 + lVar13) * 4) = iVar11;
            iVar11 = iVar11 + this->dilation_w;
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 < this->kernel_w);
          iVar16 = iVar16 + (int)lVar13;
        }
        iVar11 = iVar11 + (iVar9 * iVar4 - iVar5 * iVar12);
        iVar8 = iVar8 + 1;
      } while (iVar8 < this->kernel_h);
    }
    local_4d8 = (long)this->num_output;
    if (0 < local_4d8) {
      local_4e0 = top_blob->data;
      local_4e8 = top_blob->cstep * top_blob->elemsize;
      local_4d0 = (long)(int)uVar15;
      iVar9 = 0;
      local_578 = 0;
      do {
        if (-1 < iVar19) {
          pvVar7 = (void *)(local_4e8 * local_578 + (long)local_4e0);
          iVar4 = this->bias_term;
          local_4c0 = (void *)((long)iVar9 * 4 + (long)(this->weight_data).data);
          iVar5 = 0;
          do {
            if (-1 < (int)local_4c8) {
              pvVar10 = (this->bias_data).data;
              local_4b0 = (void *)((long)(local_498.params[0].v.elemsize._4_4_ * iVar5 *
                                         this->stride_h) * 4 + local_498.params[0]._0_8_);
              local_4b8 = (long)this->stride_w;
              uVar14 = 0;
              do {
                if (iVar4 == 0) {
                  fVar24 = 0.0;
                }
                else {
                  fVar24 = *(float *)((long)pvVar10 + local_578 * 4);
                }
                if (0 < (int)uVar1) {
                  uVar22 = 0;
                  pvVar17 = local_4c0;
                  do {
                    if (0 < (int)uVar20) {
                      uVar18 = 0;
                      do {
                        fVar24 = fVar24 + *(float *)((long)pvVar17 + uVar18 * 4) *
                                          *(float *)((long)local_4b0 +
                                                    (long)*(int *)(local_548._0_8_ + uVar18 * 4) * 4
                                                    + local_498.params[0].v._32_8_ *
                                                      (long)local_498.params[0].v.refcount * uVar22
                                                      + uVar14 * local_4b8 * 4);
                        uVar18 = uVar18 + 1;
                      } while (uVar20 != uVar18);
                    }
                    uVar22 = uVar22 + 1;
                    pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar20 * 4);
                  } while (uVar22 != uVar1);
                }
                *(float *)((long)pvVar7 + uVar14 * 4) = fVar24;
                uVar14 = uVar14 + 1;
              } while (uVar14 != uVar15);
            }
            pvVar7 = (void *)((long)pvVar7 + local_4d0 * 4);
            bVar23 = iVar5 != iVar19;
            iVar5 = iVar5 + 1;
          } while (bVar23);
        }
        local_578 = local_578 + 1;
        iVar9 = iVar9 + uVar1 * uVar20;
      } while (local_578 != local_4d8);
    }
    if ((pointer)local_548._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_548._0_8_,local_538._0_8_ - local_548._0_8_);
    }
    iVar5 = 0;
  }
LAB_0013121a:
  if ((int *)local_498.params[0].v.data != (int *)0x0) {
    LOCK();
    *(int *)local_498.params[0].v.data = *local_498.params[0].v.data + -1;
    UNLOCK();
    if ((*local_498.params[0].v.data == 0) && ((void *)local_498.params[0]._0_8_ != (void *)0x0)) {
      free(*(void **)(local_498.params[0]._0_8_ + -8));
    }
  }
  return iVar5;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            op->load_model(ModelBinFromMatArray(weights));

            // forward
            op->forward(bottom_blob, top_blob);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered = bottom_blob;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}